

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_interval.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformInterval(Transformer *this,PGIntervalConstant *node)

{
  int iVar1;
  BaseExpression *pBVar2;
  undefined8 uVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  Transformer *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var9;
  type expr;
  ParserException *pPVar10;
  InternalException *pIVar11;
  long in_RDX;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  string fname;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children_1;
  LogicalType parse_type;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_100;
  Value local_f8;
  LogicalType local_b8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [48];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_58;
  LogicalType local_40;
  
  local_100._M_head_impl = (ParsedExpression *)0x0;
  iVar1 = *(int *)(in_RDX + 4);
  if (iVar1 == 0xd9) {
    Value::Value(&local_f8,*(int32_t *)(in_RDX + 0x10));
    _Var9._M_head_impl = (ParsedExpression *)operator_new(0x78);
    Value::Value((Value *)local_98,&local_f8);
    ConstantExpression::ConstantExpression
              ((ConstantExpression *)_Var9._M_head_impl,(Value *)local_98);
LAB_00e74150:
    Value::~Value((Value *)local_98);
    if (local_100._M_head_impl != (ParsedExpression *)0x0) {
      pBVar2 = &(local_100._M_head_impl)->super_BaseExpression;
      local_100._M_head_impl = _Var9._M_head_impl;
      (*pBVar2->_vptr_BaseExpression[1])();
      _Var9._M_head_impl = local_100._M_head_impl;
    }
    local_100._M_head_impl = _Var9._M_head_impl;
    Value::~Value(&local_f8);
  }
  else {
    if (iVar1 == 0xdb) {
      Value::Value(&local_f8,*(char **)(in_RDX + 8));
      _Var9._M_head_impl = (ParsedExpression *)operator_new(0x78);
      Value::Value((Value *)local_98,&local_f8);
      ConstantExpression::ConstantExpression
                ((ConstantExpression *)_Var9._M_head_impl,(Value *)local_98);
      goto LAB_00e74150;
    }
    if (iVar1 != 0x161) {
      pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
      local_98._0_8_ = local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Unsupported interval transformation","");
      InternalException::InternalException(pIVar11,(string *)local_98);
      __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)local_98,(optional_ptr<duckdb_libpgquery::PGNode,_true>)node)
    ;
    uVar3 = local_98._0_8_;
    _Var9._M_head_impl = local_100._M_head_impl;
    local_98._0_8_ = (Transformer *)0x0;
    local_100._M_head_impl = (ParsedExpression *)uVar3;
    if (_Var9._M_head_impl != (ParsedExpression *)0x0) {
      (*((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      if ((Transformer *)local_98._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_98._0_8_ + 8))();
      }
    }
  }
  if (*(long *)(in_RDX + 0x20) == 0) {
    this_00 = (Transformer *)operator_new(0x60);
    LogicalType::LogicalType((LogicalType *)local_98,INTERVAL);
    local_f8.type_._0_8_ = local_100._M_head_impl;
    local_100._M_head_impl = (ParsedExpression *)0x0;
    CastExpression::CastExpression
              ((CastExpression *)this_00,(LogicalType *)local_98,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_f8,false);
    if ((Transformer *)local_f8.type_._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_f8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
    local_f8.type_.id_ = INVALID;
    local_f8.type_.physical_type_ = ~INVALID;
    local_f8.type_._2_6_ = 0;
    LogicalType::~LogicalType((LogicalType *)local_98);
    (this->parent).ptr = this_00;
    goto LAB_00e74638;
  }
  local_98._0_8_ = **(long **)(*(long *)(in_RDX + 0x20) + 8);
  optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
            ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_98);
  uVar7 = NumericCastImpl<int,_long,_false>::Convert(*(idx_t *)(local_98._0_8_ + 0x10));
  local_98._8_8_ = (element_type *)0x0;
  local_88[0] = '\0';
  local_98._0_8_ = (Transformer *)local_88;
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LogicalType(&local_b8);
  uVar8 = ~uVar7;
  if ((uVar8 & 6) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"YEAR TO MONTH is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0x408) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"DAY TO HOUR is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0x808) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"DAY TO MINUTE is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0x1008) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"DAY TO SECOND is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0xc00) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"HOUR TO MINUTE is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0x1400) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"HOUR TO SECOND is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar8 & 0x1800) == 0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"MINUTE TO SECOND is not supported","");
    ParserException::ParserException(pPVar10,(string *)&local_f8);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((uVar7 & 4) == 0) {
    if ((uVar7 & 2) != 0) {
      ::std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)local_98._8_8_,0x1d9a6c5);
      LogicalType::LogicalType(&local_f8.type_,INTEGER);
      goto LAB_00e743fb;
    }
    if ((uVar7 & 8) != 0) {
      ::std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)local_98._8_8_,0x1d9a6cf);
      LogicalType::LogicalType(&local_f8.type_,INTEGER);
      goto LAB_00e743fb;
    }
    if ((uVar7 >> 10 & 1) != 0) {
      ::std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)local_98._8_8_,0x1d9a6d7);
      LogicalType::LogicalType(&local_f8.type_,BIGINT);
      goto LAB_00e743fb;
    }
    if ((uVar7 >> 0xb & 1) == 0) {
      if ((uVar7 >> 0xc & 1) == 0) {
        if ((uVar7 >> 0xd & 1) == 0) {
          if ((uVar7 >> 0xe & 1) == 0) {
            if ((uVar7 >> 0x18 & 1) == 0) {
              if ((uVar7 >> 0x1d & 1) == 0) {
                if ((uVar7 >> 0x19 & 1) == 0) {
                  if ((uVar7 >> 0x1a & 1) == 0) {
                    if ((uVar7 >> 0x1b & 1) == 0) {
                      pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
                      local_f8.type_._0_8_ =
                           &local_f8.type_.type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f8,"Unsupported interval post-fix","");
                      InternalException::InternalException(pIVar11,(string *)&local_f8);
                      __cxa_throw(pIVar11,&InternalException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    ::std::__cxx11::string::operator=((string *)local_98,"to_millennia");
                    LogicalType::LogicalType(&local_f8.type_,INTEGER);
                  }
                  else {
                    ::std::__cxx11::string::operator=((string *)local_98,"to_centuries");
                    LogicalType::LogicalType(&local_f8.type_,INTEGER);
                  }
                }
                else {
                  ::std::__cxx11::string::operator=((string *)local_98,"to_decades");
                  LogicalType::LogicalType(&local_f8.type_,INTEGER);
                }
              }
              else {
                ::std::__cxx11::string::operator=((string *)local_98,"to_quarters");
                LogicalType::LogicalType(&local_f8.type_,INTEGER);
              }
            }
            else {
              ::std::__cxx11::string::operator=((string *)local_98,"to_weeks");
              LogicalType::LogicalType(&local_f8.type_,INTEGER);
            }
          }
          else {
            ::std::__cxx11::string::operator=((string *)local_98,"to_microseconds");
            LogicalType::LogicalType(&local_f8.type_,BIGINT);
          }
        }
        else {
          ::std::__cxx11::string::operator=((string *)local_98,"to_milliseconds");
          LogicalType::LogicalType(&local_f8.type_,DOUBLE);
        }
      }
      else {
        ::std::__cxx11::string::operator=((string *)local_98,"to_seconds");
        LogicalType::LogicalType(&local_f8.type_,DOUBLE);
      }
    }
    else {
      ::std::__cxx11::string::operator=((string *)local_98,"to_minutes");
      LogicalType::LogicalType(&local_f8.type_,BIGINT);
    }
    LogicalType::operator=(&local_b8,&local_f8.type_);
  }
  else {
    ::std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)local_98._8_8_,0x1d9a6bc);
    LogicalType::LogicalType(&local_f8.type_,INTEGER);
LAB_00e743fb:
    _Var5._M_pi = local_b8.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar4 = local_b8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = local_f8.type_._0_8_;
    local_b8.id_ = local_f8.type_.id_;
    local_b8.physical_type_ = local_f8.type_.physical_type_;
    local_b8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_f8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_f8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_f8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    local_f8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    local_f8.type_._0_8_ = uVar3;
  }
  LogicalType::~LogicalType(&local_f8.type_);
  _Var9._M_head_impl = (ParsedExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_f8.type_,&local_40);
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_100._M_head_impl;
  local_100._M_head_impl = (ParsedExpression *)0x0;
  CastExpression::CastExpression
            ((CastExpression *)_Var9._M_head_impl,&local_f8.type_,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_58,false);
  if ((Transformer *)
      local_58.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Transformer *)0x0) {
    (*(((ParsedExpression *)
       &(local_58.
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      ->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LogicalType::~LogicalType(&local_f8.type_);
  if (local_100._M_head_impl != (ParsedExpression *)0x0) {
    pBVar2 = &(local_100._M_head_impl)->super_BaseExpression;
    local_100._M_head_impl = _Var9._M_head_impl;
    (*pBVar2->_vptr_BaseExpression[1])();
    _Var9._M_head_impl = local_100._M_head_impl;
  }
  local_100._M_head_impl = _Var9._M_head_impl;
  bVar6 = LogicalType::operator==(&local_b8,&local_40);
  if (!bVar6) {
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_58,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_100);
    make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_f8,(char (*) [6])0x1edbb4b,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_58);
    uVar3 = local_f8.type_._0_8_;
    _Var9._M_head_impl = local_100._M_head_impl;
    local_f8.type_._0_8_ = (long *)0x0;
    local_100._M_head_impl = (ParsedExpression *)uVar3;
    if ((CastExpression *)_Var9._M_head_impl != (CastExpression *)0x0) {
      (*((BaseExpression *)&((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
      if ((long *)local_f8.type_._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_f8.type_._0_8_ + 8))();
      }
    }
    _Var9._M_head_impl = (ParsedExpression *)operator_new(0x60);
    LogicalType::LogicalType(&local_f8.type_,&local_b8);
    local_a0._M_head_impl = local_100._M_head_impl;
    local_100._M_head_impl = (ParsedExpression *)0x0;
    CastExpression::CastExpression
              ((CastExpression *)_Var9._M_head_impl,&local_f8.type_,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_a0,false);
    if (local_a0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_a0._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType(&local_f8.type_);
    if (local_100._M_head_impl != (ParsedExpression *)0x0) {
      pBVar2 = &(local_100._M_head_impl)->super_BaseExpression;
      local_100._M_head_impl = _Var9._M_head_impl;
      (*pBVar2->_vptr_BaseExpression[1])();
      _Var9._M_head_impl = local_100._M_head_impl;
    }
    local_100._M_head_impl = _Var9._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_58);
  }
  local_f8.type_.id_ = INVALID;
  local_f8.type_.physical_type_ = ~INVALID;
  local_f8.type_._2_6_ = 0;
  local_f8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_f8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&local_f8,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_100);
  make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((duckdb *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_f8);
  expr = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
         ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                      *)&local_58);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x28));
  (this->parent).ptr =
       (Transformer *)
       local_58.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_f8);
  LogicalType::~LogicalType(&local_b8);
  LogicalType::~LogicalType(&local_40);
  if ((Transformer *)local_98._0_8_ != (Transformer *)local_88) {
    operator_delete((void *)local_98._0_8_);
  }
LAB_00e74638:
  if ((CastExpression *)local_100._M_head_impl != (CastExpression *)0x0) {
    (*((BaseExpression *)&((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformInterval(duckdb_libpgquery::PGIntervalConstant &node) {
	// handle post-fix notation of INTERVAL

	// three scenarios
	// interval (expr) year
	// interval 'string' year
	// interval int year
	unique_ptr<ParsedExpression> expr;
	switch (node.val_type) {
	case duckdb_libpgquery::T_PGAExpr:
		expr = TransformExpression(node.eval);
		break;
	case duckdb_libpgquery::T_PGString:
		expr = make_uniq<ConstantExpression>(Value(node.sval));
		break;
	case duckdb_libpgquery::T_PGInteger:
		expr = make_uniq<ConstantExpression>(Value(node.ival));
		break;
	default:
		throw InternalException("Unsupported interval transformation");
	}

	if (!node.typmods) {
		return make_uniq<CastExpression>(LogicalType::INTERVAL, std::move(expr));
	}

	int32_t mask = NumericCast<int32_t>(
	    PGPointerCast<duckdb_libpgquery::PGAConst>(node.typmods->head->data.ptr_value)->val.val.ival);
	// these seemingly random constants are from libpg_query/include/utils/datetime.hpp
	// they are copied here to avoid having to include this header
	// the bitshift is from the function INTERVAL_MASK in the parser
	constexpr int32_t MONTH_MASK = 1 << 1;
	constexpr int32_t YEAR_MASK = 1 << 2;
	constexpr int32_t DAY_MASK = 1 << 3;
	constexpr int32_t HOUR_MASK = 1 << 10;
	constexpr int32_t MINUTE_MASK = 1 << 11;
	constexpr int32_t SECOND_MASK = 1 << 12;
	constexpr int32_t MILLISECOND_MASK = 1 << 13;
	constexpr int32_t MICROSECOND_MASK = 1 << 14;
	constexpr int32_t WEEK_MASK = 1 << 24;
	constexpr int32_t DECADE_MASK = 1 << 25;
	constexpr int32_t CENTURY_MASK = 1 << 26;
	constexpr int32_t MILLENNIUM_MASK = 1 << 27;
	constexpr int32_t QUARTER_MASK = 1 << 29;

	// we need to check certain combinations
	// because certain interval masks (e.g. INTERVAL '10' HOURS TO DAYS) set multiple bits
	// for now we don't support all of the combined ones
	// (we might add support if someone complains about it)

	string fname;
	LogicalType parse_type = LogicalType::DOUBLE;
	LogicalType target_type;
	if (mask & YEAR_MASK && mask & MONTH_MASK) {
		// DAY TO HOUR
		throw ParserException("YEAR TO MONTH is not supported");
	} else if (mask & DAY_MASK && mask & HOUR_MASK) {
		// DAY TO HOUR
		throw ParserException("DAY TO HOUR is not supported");
	} else if (mask & DAY_MASK && mask & MINUTE_MASK) {
		// DAY TO MINUTE
		throw ParserException("DAY TO MINUTE is not supported");
	} else if (mask & DAY_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("DAY TO SECOND is not supported");
	} else if (mask & HOUR_MASK && mask & MINUTE_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO MINUTE is not supported");
	} else if (mask & HOUR_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("HOUR TO SECOND is not supported");
	} else if (mask & MINUTE_MASK && mask & SECOND_MASK) {
		// DAY TO SECOND
		throw ParserException("MINUTE TO SECOND is not supported");
	} else if (mask & YEAR_MASK) {
		// YEAR
		fname = "to_years";
		target_type = LogicalType::INTEGER;
	} else if (mask & MONTH_MASK) {
		// MONTH
		fname = "to_months";
		target_type = LogicalType::INTEGER;
	} else if (mask & DAY_MASK) {
		// DAY
		fname = "to_days";
		target_type = LogicalType::INTEGER;
	} else if (mask & HOUR_MASK) {
		// HOUR
		fname = "to_hours";
		target_type = LogicalType::BIGINT;
	} else if (mask & MINUTE_MASK) {
		// MINUTE
		fname = "to_minutes";
		target_type = LogicalType::BIGINT;
	} else if (mask & SECOND_MASK) {
		// SECOND
		fname = "to_seconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MILLISECOND_MASK) {
		// MILLISECOND
		fname = "to_milliseconds";
		target_type = LogicalType::DOUBLE;
	} else if (mask & MICROSECOND_MASK) {
		// MICROSECOND
		fname = "to_microseconds";
		target_type = LogicalType::BIGINT;
	} else if (mask & WEEK_MASK) {
		// WEEK
		fname = "to_weeks";
		target_type = LogicalType::INTEGER;
	} else if (mask & QUARTER_MASK) {
		// QUARTER
		fname = "to_quarters";
		target_type = LogicalType::INTEGER;
	} else if (mask & DECADE_MASK) {
		// DECADE
		fname = "to_decades";
		target_type = LogicalType::INTEGER;
	} else if (mask & CENTURY_MASK) {
		// CENTURY
		fname = "to_centuries";
		target_type = LogicalType::INTEGER;
	} else if (mask & MILLENNIUM_MASK) {
		// MILLENNIUM
		fname = "to_millennia";
		target_type = LogicalType::INTEGER;
	} else {
		throw InternalException("Unsupported interval post-fix");
	}
	// first push a cast to the parse type
	expr = make_uniq<CastExpression>(parse_type, std::move(expr));

	// next, truncate it if the target type doesn't match the parse type
	if (target_type != parse_type) {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(expr));
		expr = make_uniq<FunctionExpression>("trunc", std::move(children));
		expr = make_uniq<CastExpression>(target_type, std::move(expr));
	}
	// now push the operation
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(std::move(expr));
	auto result = make_uniq<FunctionExpression>(fname, std::move(children));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}